

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O2

void __thiscall Clasp::ScheduleStrategy::advanceTo(ScheduleStrategy *this,uint32 n)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  
  if (this->len - 1 < n) {
    dVar3 = (double)this->len;
    dVar2 = (dVar3 * 4.0 + -4.0) * dVar3 + (double)(n + 1) * 8.0;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    uVar1 = (uint)((ulong)(long)((dVar2 - (dVar3 + dVar3)) + 1.0) >> 1) & 0x7fffffff;
    this->idx = n - (int)(long)((double)uVar1 * dVar3 +
                               (double)(int)(uVar1 - 1) * (double)uVar1 * 0.5);
    this->len = this->len + uVar1;
  }
  else {
    this->idx = n;
  }
  return;
}

Assistant:

void ScheduleStrategy::advanceTo(uint32 n) {
	if (!len || n < len)       {
		idx = n;
		return;
	}
	if (type != Luby) {
		double dLen = len;
		uint32 x    = uint32(sqrt(dLen * (4.0 * dLen - 4.0) + 8.0 * double(n+1))-2*dLen+1)/2;
		idx         = n - uint32(x*dLen+double(x-1.0)*x/2.0);
		len        += x;
		return;
	}
	while (n >= len) {
		n   -= len++;
		len *= 2;
	}
	idx = n;
}